

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_parse_url_path(Curl_easy *data)

{
  uchar uVar1;
  connectdata *pcVar2;
  FILEPROTO *pFVar3;
  size_t sVar4;
  Curl_easy *pCVar5;
  CURLcode CVar6;
  int iVar7;
  char **ppcVar8;
  char *__dest;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  size_t sStack_60;
  char *rawPath;
  size_t pathLen;
  Curl_easy *local_40;
  FILEPROTO *local_38;
  
  pcVar2 = data->conn;
  pFVar3 = (data->req).p.file;
  rawPath = (char *)0x0;
  pathLen = 0;
  (pcVar2->proto).ftpc.ctl_valid = false;
  (pcVar2->proto).ftpc.cwdfail = false;
  CVar6 = Curl_urldecode(pFVar3->path,0,&rawPath,&pathLen,REJECT_CTRL);
  pcVar9 = rawPath;
  if (CVar6 != CURLE_OK) {
    Curl_failf(data,"path contains control characters");
    return CVar6;
  }
  uVar1 = (data->set).ftp_filemethod;
  local_38 = pFVar3;
  if (uVar1 == '\x03') {
    pcVar12 = strrchr(rawPath,0x2f);
    if (pcVar12 == (char *)0x0) goto LAB_00130bea;
    sVar10 = (long)pcVar12 - (long)pcVar9;
    if ((long)pcVar12 - (long)pcVar9 == 0) {
      sVar10 = 1;
    }
    ppcVar8 = (char **)(*Curl_ccalloc)(1,8);
    (pcVar2->proto).ftpc.dirs = ppcVar8;
    if (ppcVar8 == (char **)0x0) {
LAB_00130bcf:
      (*Curl_cfree)(rawPath);
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar9 = (char *)(*Curl_ccalloc)(1,sVar10 + 1);
    *(pcVar2->proto).ftpc.dirs = pcVar9;
    pcVar9 = *(pcVar2->proto).ftpc.dirs;
    if (pcVar9 == (char *)0x0) goto LAB_00130bcf;
    strncpy(pcVar9,rawPath,sVar10);
    (pcVar2->proto).ftpc.dirdepth = 1;
    pcVar9 = pcVar12 + 1;
  }
  else {
    if (uVar1 != '\x02') {
      iVar7 = 0;
      pcVar12 = rawPath;
      do {
        if (*pcVar12 == '/') {
          iVar7 = iVar7 + 1;
        }
        else if (*pcVar12 == '\0') goto LAB_00130b34;
        pcVar12 = pcVar12 + 1;
      } while( true );
    }
    if ((pathLen == 0) || (rawPath[pathLen - 1] == '/')) goto LAB_00130c03;
  }
LAB_00130bef:
  if (*pcVar9 == '\0') goto LAB_00130c03;
  pcVar9 = (*Curl_cstrdup)(pcVar9);
LAB_00130c05:
  sVar4 = pathLen;
  (pcVar2->proto).ftpc.file = pcVar9;
  if (((((data->set).field_0x8e5 & 4) != 0) && (pcVar9 == (char *)0x0)) && (local_38->fd == 0)) {
    Curl_failf(data,"Uploading to a URL without a file name");
    (*Curl_cfree)(rawPath);
    return CURLE_URL_MALFORMAT;
  }
  (pcVar2->proto).ftpc.cwddone = false;
  uVar1 = (data->set).ftp_filemethod;
  if ((uVar1 != '\x02') || (*rawPath != '/')) {
    if (((pcVar2->bits).field_0x4 & 0x80) == 0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pcVar2->proto).ftpc.prevpath;
      if (pcVar12 == (char *)0x0) goto LAB_00130ce2;
    }
    if (uVar1 == '\x02') {
      sVar10 = 0;
    }
    else {
      if (pcVar9 == (char *)0x0) {
        sVar10 = 0;
      }
      else {
        sVar10 = strlen(pcVar9);
      }
      sVar10 = sVar4 - sVar10;
    }
    sVar11 = strlen(pcVar12);
    if ((sVar11 != sVar10) || (iVar7 = strncmp(rawPath,pcVar12,sVar10), iVar7 != 0))
    goto LAB_00130ce2;
    Curl_infof(data,"Request has same path as previous transfer");
  }
  (pcVar2->proto).ftpc.cwddone = true;
LAB_00130ce2:
  (*Curl_cfree)(rawPath);
  return CURLE_OK;
LAB_00130b34:
  if (0 < iVar7) {
    ppcVar8 = (char **)(*Curl_ccalloc)((size_t)iVar7,8);
    (pcVar2->proto).ftpc.dirs = ppcVar8;
    pCVar5 = data;
    if (ppcVar8 == (char **)0x0) goto LAB_00130bcf;
    while (local_40 = pCVar5, pcVar12 = strchr(pcVar9,0x2f), data = local_40, pcVar12 != (char *)0x0
          ) {
      sStack_60 = (long)pcVar12 - (long)pcVar9;
      if ((sStack_60 != 0) || (sStack_60 = 1, (pcVar2->proto).ftpc.dirdepth == 0)) {
        __dest = (char *)(*Curl_ccalloc)(1,sStack_60 + 1);
        if (__dest == (char *)0x0) goto LAB_00130bcf;
        strncpy(__dest,pcVar9,sStack_60);
        iVar7 = (pcVar2->proto).ftpc.dirdepth;
        (pcVar2->proto).ftpc.dirdepth = iVar7 + 1;
        (pcVar2->proto).ftpc.dirs[iVar7] = __dest;
      }
      pcVar9 = pcVar12 + 1;
      pCVar5 = local_40;
    }
  }
LAB_00130bea:
  if (pcVar9 != (char *)0x0) goto LAB_00130bef;
LAB_00130c03:
  pcVar9 = (char *)0x0;
  goto LAB_00130c05;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct Curl_easy *data)
{
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result) {
    failf(data, "path contains control characters");
    return result;
  }

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
          fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
            dirlen++;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = calloc(1, dirlen + 1);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        strncpy(ftpc->dirs[0], rawPath, dirlen);
        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is file name */
      }
      else
        fileName = rawPath; /* file name only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      int dirAlloc = 0; /* number of entries allocated for the 'dirs' array */
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if (*str == '/')
          ++dirAlloc;

      if(dirAlloc > 0) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/'))) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = calloc(1, compLen + 1);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            strncpy(comp, curPos, compLen);
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT(ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the file name (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == PPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file?strlen(ftpc->file):0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}